

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

void asmjit::v1_14::JitAllocatorImpl_insertBlock
               (JitAllocatorPrivateImpl *impl,JitAllocatorBlock *block)

{
  bool bVar1;
  uint32_t uVar2;
  JitAllocatorPool *this;
  size_t sVar3;
  JitAllocatorBlock *in_RSI;
  size_t statIndex;
  JitAllocatorPool *pool;
  Compare<(asmjit::v1_14::Support::SortOrder)0> *in_stack_00000040;
  JitAllocatorBlock *in_stack_00000048;
  ZoneTree<asmjit::v1_14::JitAllocatorBlock> *in_stack_00000050;
  
  this = JitAllocatorBlock::pool(in_RSI);
  if (this->cursor == (JitAllocatorBlock *)0x0) {
    this->cursor = in_RSI;
  }
  ZoneTree<asmjit::v1_14::JitAllocatorBlock>::
  insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>
            (in_stack_00000050,in_stack_00000048,in_stack_00000040);
  ZoneList<asmjit::v1_14::JitAllocatorBlock>::_addNode(&this->blocks,in_RSI,1);
  bVar1 = JitAllocatorBlock::hasLargePages((JitAllocatorBlock *)0x143bf1);
  this->blockCount = this->blockCount + 1;
  uVar2 = JitAllocatorBlock::areaSize(in_RSI);
  this->totalAreaSize[bVar1] = (ulong)uVar2 + this->totalAreaSize[bVar1];
  uVar2 = JitAllocatorBlock::areaUsed(in_RSI);
  this->totalAreaUsed[bVar1] = (ulong)uVar2 + this->totalAreaUsed[bVar1];
  uVar2 = JitAllocatorBlock::areaSize(in_RSI);
  sVar3 = JitAllocatorImpl_bitVectorSizeToByteSize(uVar2);
  this->totalOverheadBytes = sVar3 * 2 + 0x68 + this->totalOverheadBytes;
  return;
}

Assistant:

static void JitAllocatorImpl_insertBlock(JitAllocatorPrivateImpl* impl, JitAllocatorBlock* block) noexcept {
  JitAllocatorPool* pool = block->pool();

  if (!pool->cursor)
    pool->cursor = block;

  // Add to RBTree and List.
  impl->tree.insert(block);
  pool->blocks.append(block);

  // Update statistics.
  size_t statIndex = size_t(block->hasLargePages());
  pool->blockCount++;
  pool->totalAreaSize[statIndex] += block->areaSize();
  pool->totalAreaUsed[statIndex] += block->areaUsed();
  pool->totalOverheadBytes += sizeof(JitAllocatorBlock) + JitAllocatorImpl_bitVectorSizeToByteSize(block->areaSize()) * 2u;
}